

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_A_ScreamAndUnblock(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *self;
  char *__assertion;
  long lVar3;
  VMValue params [3];
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00499965;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_00499859:
        self = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00499965;
        }
      }
      if (numparam == 1) goto LAB_004998d9;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00499955;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00499965;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_00499955;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_004998d9:
        params[0].field_0._8_4_ = 1;
        params[0].field_0.field_3.Type = '\x03';
        params[1].field_0.field_3.Type = '\x03';
        params[2].field_0.field_1.a = (void *)0x0;
        params[2].field_0.field_1.atag = 8;
        params[2].field_0.field_3.Type = '\x03';
        params[0].field_0._0_8_ = self;
        params[1].field_0._0_8_ = self;
        params[1].field_0._8_4_ = params[0].field_0._8_4_;
        VMFrameStack::Call(stack,&A_Scream_VMPtr->super_VMFunction,params,3,(VMReturn *)0x0,0,
                           (VMException **)0x0);
        lVar3 = 0x20;
        do {
          VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar3));
          lVar3 = lVar3 + -0x10;
        } while (lVar3 != -0x10);
        A_Unblock(self,true);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00499965;
    }
    if (self == (AActor *)0x0) goto LAB_00499859;
  }
LAB_00499955:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00499965:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                ,0xc07,"int AF_A_ScreamAndUnblock(VMFrameStack *, VMValue *, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ScreamAndUnblock)
{
	PARAM_ACTION_PROLOGUE;
	CALL_ACTION(A_Scream, self);
	A_Unblock(self, true);
	return 0;
}